

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDSAPublicKey.cpp
# Opt level: O0

void __thiscall OSSLDSAPublicKey::~OSSLDSAPublicKey(OSSLDSAPublicKey *this)

{
  DSAPublicKey *in_RDI;
  
  (in_RDI->super_PublicKey).super_Serialisable._vptr_Serialisable =
       (_func_int **)&PTR_serialise_0017ba30;
  DSA_free((DSA *)in_RDI[1].super_PublicKey.super_Serialisable._vptr_Serialisable);
  DSAPublicKey::~DSAPublicKey(in_RDI);
  return;
}

Assistant:

OSSLDSAPublicKey::~OSSLDSAPublicKey()
{
	DSA_free(dsa);
}